

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  char *desc;
  bool local_51;
  bool has_address_operands;
  Limits *limits3_local;
  Limits *limits2_local;
  Limits *limits1_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  local_51 = true;
  if ((limits1 == (Limits *)0x0) && (local_51 = true, limits2 == (Limits *)0x0)) {
    local_51 = limits3 != (Limits *)0x0;
  }
  this_local._0_4_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1((Opcode *)&this_local);
  TVar1 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar1,limits1,local_51);
  TVar2 = Opcode::GetParamType2((Opcode *)&this_local);
  TVar2 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar2,limits2,local_51);
  TVar3 = Opcode::GetParamType3((Opcode *)&this_local);
  TVar3 = Opcode::GetMemoryParam((Opcode *)&this_local,TVar3,limits3,local_51);
  desc = Opcode::GetName((Opcode *)&this_local);
  this_local._4_4_ = PopAndCheck3Types(this,TVar1,TVar2,TVar3,desc);
  TVar1 = Opcode::GetResultType((Opcode *)&this_local);
  PushType(this,TVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  bool has_address_operands = limits1 || limits2 || limits3;
  Result result =
      PopAndCheck3Types(opcode.GetMemoryParam(opcode.GetParamType1(), limits1,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType2(), limits2,
                                              has_address_operands),
                        opcode.GetMemoryParam(opcode.GetParamType3(), limits3,
                                              has_address_operands),
                        opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}